

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.cpp
# Opt level: O0

bool window_is_color_proc(Am_Object *self)

{
  Am_Value *this;
  Am_Ptr ptr;
  Am_Drawonable *this_00;
  Am_Drawonable *d;
  Am_Object *self_local;
  
  this = Am_Object::Get(self,0x7d2,0);
  ptr = Am_Value::operator_cast_to_void_(this);
  this_00 = Am_Drawonable::Narrow(ptr);
  if (this_00 == (Am_Drawonable *)0x0) {
    self_local._7_1_ = true;
  }
  else {
    self_local._7_1_ = Am_Drawonable::Is_Color(this_00);
  }
  return self_local._7_1_;
}

Assistant:

Am_Define_Formula(bool, window_is_color)
{
  Am_Drawonable *d = Am_Drawonable::Narrow(self.Get(Am_DRAWONABLE));
  // is there a better way to determine if d is valid?
  if (d)
    return d->Is_Color();
  else
    return true;
}